

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O1

float FBaseCVar::ToFloat(UCVarValue value,ECVarType type)

{
  double dVar1;
  float local_8;
  
  local_8 = (float)value.Int;
  switch(type) {
  case CVAR_Bool:
    local_8._0_1_ = value.Bool;
    local_8 = (float)(local_8._0_1_ & 1);
    break;
  case CVAR_Int:
    local_8 = (float)(int)local_8;
    break;
  case CVAR_Float:
    break;
  case CVAR_String:
    dVar1 = strtod(value.String,(char **)0x0);
    local_8 = (float)dVar1;
    break;
  default:
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

float FBaseCVar::ToFloat (UCVarValue value, ECVarType type)
{
	switch (type)
	{
	case CVAR_Bool:
		return (float)value.Bool;

	case CVAR_Int:
		return (float)value.Int;

	case CVAR_Float:
		return value.Float;

	case CVAR_String:
		return (float)strtod (value.String, NULL);

	case CVAR_GUID:
		return 0.f;

	default:
		return 0.f;
	}
}